

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O1

void __thiscall
WeightedReservoir_Basic_Test::~WeightedReservoir_Basic_Test(WeightedReservoir_Basic_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(WeightedReservoir, Basic) {
    RNG rng;
    constexpr int n = 16;
    float weights[n];
    for (int i = 0; i < n; ++i)
        weights[i] = .05 + Sqr(rng.Uniform<Float>());

    std::atomic<int> count[n] = {};
    int64_t nTrials = 1000000;
    ParallelFor(0, nTrials, [&](int64_t start, int64_t end) {
#ifdef PBRT_IS_MSVC
        // MSVC2019 doesn't seem to capture this as constexpr...
        constexpr int n = 16;
#endif
        RNG rng(3 * start);
        int localCount[n] = {};

        for (int64_t i = start; i < end; ++i) {
            WeightedReservoirSampler<int> wrs(i);
            int perm[n];
            for (int j = 0; j < n; ++j)
                perm[j] = j;

            for (int j = 0; j < n; ++j) {
                int index = perm[j];
                wrs.Add(index, weights[index]);
            }

            int index = wrs.GetSample();
            ASSERT_TRUE(index >= 0 && index < n);
            ++localCount[index];
        }

        for (int i = 0; i < n; ++i)
            count[i] += localCount[i];
    });

    Float sumW = std::accumulate(std::begin(weights), std::end(weights), Float(0));
    for (int i = 0; i < n; ++i) {
        EXPECT_LE(.97 * count[i] / double(nTrials), weights[i] / sumW);
        EXPECT_GE(1.03 * count[i] / double(nTrials), weights[i] / sumW);
    }
}